

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorstream.h
# Opt level: O1

void __thiscall
dlib::vectorstream::vectorstream(vectorstream *this,vector<char,_std::allocator<char>_> *buffer)

{
  std::ios_base::ios_base((ios_base *)&this->field_0x68);
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined2 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(undefined8 *)&this->field_0x158 = 0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(undefined8 *)&this->field_0x168 = 0;
  *(undefined8 *)this = 0x31a3d8;
  *(undefined8 *)&this->field_0x68 = 0x31a428;
  *(undefined8 *)&this->field_0x10 = 0x31a400;
  std::iostream::iostream(this,(streambuf *)&PTR_construction_vtable_24__0031a440);
  *(undefined8 *)this = 0x31a3d8;
  *(undefined8 *)&this->field_0x68 = 0x31a428;
  *(undefined8 *)&this->field_0x10 = 0x31a400;
  *(code **)&this->buf = png_get_image_width;
  *(undefined8 *)&(this->buf).field_0x8 = 0;
  *(undefined8 *)&(this->buf).field_0x10 = 0;
  *(undefined8 *)&(this->buf).field_0x18 = 0;
  *(undefined8 *)&(this->buf).field_0x20 = 0;
  *(undefined8 *)&(this->buf).field_0x28 = 0;
  *(undefined8 *)&(this->buf).field_0x30 = 0;
  std::locale::locale((locale *)&(this->buf).field_0x38);
  *(undefined ***)&this->buf = &PTR__streambuf_0031a5c8;
  (this->buf).read_pos = 0;
  (this->buf).buffer = buffer;
  return;
}

Assistant:

vectorstream (
            std::vector<char>& buffer
        ) :
            std::iostream(&buf),
            buf(buffer)
        {}